

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

int Gia_ManGraphToAig(Gia_Man_t *p,Dec_Graph_t *pGraph)

{
  Dec_Edge_t DVar1;
  uint uVar2;
  Dec_Node_t *pDVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  DVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar5 = (uint)DVar1 >> 1 & 0x3fffffff;
    lVar8 = (long)pGraph->nLeaves;
    if (uVar5 < (uint)pGraph->nLeaves) {
      uVar5 = pGraph->pNodes[uVar5].field_2.iFunc;
      if ((int)uVar5 < 0) {
LAB_006dffa9:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = uVar5 ^ (uint)DVar1 & 1;
    }
    else {
      lVar4 = lVar8 * 0x18 + 8;
      do {
        lVar7 = lVar4;
        pDVar3 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pDVar3 + lVar7 + -8);
        if (pDVar3[uVar5 >> 1 & 0x3fffffff].field_2.iFunc < 0) goto LAB_006dffa9;
        uVar2 = *(uint *)((long)pDVar3 + lVar7 + -4);
        if (pDVar3[uVar2 >> 1 & 0x3fffffff].field_2.iFunc < 0) goto LAB_006dffa9;
        iVar6 = Gia_ManHashAnd(p,uVar5 & 1 ^ pDVar3[uVar5 >> 1 & 0x3fffffff].field_2.iFunc,
                               uVar2 & 1 ^ pDVar3[uVar2 >> 1 & 0x3fffffff].field_2.iFunc);
        *(int *)(&(pDVar3->eEdge0).field_0x0 + lVar7) = iVar6;
        lVar8 = lVar8 + 1;
        lVar4 = lVar7 + 0x18;
      } while (lVar8 < pGraph->nSize);
      uVar5 = *(uint *)(&(pDVar3->eEdge0).field_0x0 + lVar7);
      if ((int)uVar5 < 0) goto LAB_006dffa9;
      uVar5 = (uint)pGraph->eRoot & 1 ^ uVar5;
    }
  }
  else {
    uVar5 = ~(uint)DVar1 & 1;
  }
  return uVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create GIA for SOP.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManGraphToAig( Gia_Man_t * p, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i, iAnd0, iAnd1;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Dec_GraphVar(pGraph)->iFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        iAnd0 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        iAnd1 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        pNode->iFunc = Gia_ManHashAnd( p, iAnd0, iAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Dec_GraphIsComplement(pGraph) );
}